

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove.c
# Opt level: O1

int main(void)

{
  obj *poVar1;
  ll_elem *plVar2;
  long lVar3;
  int iVar4;
  ll_elem *plVar5;
  atomic_size_t *paVar6;
  
  poVar1 = data;
  lVar3 = 0;
  do {
    plVar2 = &poVar1->entry;
    *(int *)((long)(plVar2 + -1) + 0x10) = (int)lVar3;
    lVar3 = lVar3 + 1;
    plVar2->succ = 0;
    plVar2->pred = 0;
    plVar2->refcnt = 0;
    poVar1 = (obj *)(plVar2 + 1);
  } while (lVar3 != 1000);
  lVar3 = 8;
  do {
    ll_insert_tail(&list.ll_head,(ll_elem *)((long)&data[0].satelite + lVar3),0);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x7d08);
  plVar2 = ll_succ(&list.ll_head,(ll_elem *)&list);
  paVar6 = &plVar2[-1].refcnt;
  if (plVar2 == (ll_elem *)0x0) {
    paVar6 = (atomic_size_t *)0x0;
  }
  iVar4 = 0;
  while( true ) {
    if (paVar6 == (atomic_size_t *)0x0) {
      __assert_fail("o != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c"
                    ,0x17,"int main()");
    }
    if (iVar4 != (int)*paVar6) break;
    plVar5 = (ll_elem *)(paVar6 + 1);
    plVar2 = ll_succ(&list.ll_head,plVar5);
    paVar6 = &plVar2[-1].refcnt;
    if (plVar2 == (ll_elem *)0x0) {
      paVar6 = (atomic_size_t *)0x0;
    }
    ll_release(&list.ll_head,plVar5);
    iVar4 = iVar4 + 1;
    if (iVar4 == 1000) {
      ll_ref(&list.ll_head,&data[0].entry);
      iVar4 = 1;
      ll_unlink(&list.ll_head,&data[0].entry,1);
      plVar2 = ll_succ(&list.ll_head,(ll_elem *)&list);
      paVar6 = &plVar2[-1].refcnt;
      if (plVar2 == (ll_elem *)0x0) {
        paVar6 = (atomic_size_t *)0x0;
      }
      while( true ) {
        if (paVar6 == (atomic_size_t *)0x0) {
          __assert_fail("o != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c"
                        ,0x24,"int main()");
        }
        if (iVar4 != (int)*paVar6) break;
        plVar5 = (ll_elem *)(paVar6 + 1);
        plVar2 = ll_succ(&list.ll_head,plVar5);
        paVar6 = &plVar2[-1].refcnt;
        if (plVar2 == (ll_elem *)0x0) {
          paVar6 = (atomic_size_t *)0x0;
        }
        ll_release(&list.ll_head,plVar5);
        iVar4 = iVar4 + 1;
        if (iVar4 == 1000) {
          return 0;
        }
      }
      __assert_fail("o->satelite == i",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c"
                    ,0x25,"int main()");
    }
  }
  __assert_fail("o->satelite == i",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c",
                0x18,"int main()");
}

Assistant:

int
main()
{
	int i;
	struct obj *o, *next_o = NULL;

	for (i = 0; i < N; i++) {
		data[i].satelite = i;
		LL_INIT_ENTRY(&data[i].entry);
	}

	for (i = 0; i < N; i++)
		LL_PUSH_BACK(objlist, &list, &data[i]);

	for (i = 0, o = LL_FIRST(objlist, &list);
	    i < N;
	    i++, o = next_o) {
		assert(o != NULL);
		assert(o->satelite == i);

		next_o = LL_NEXT(objlist, &list, o);

		LL_RELEASE(objlist, &list, o);
	}

	LL_REF(objlist, &list, &data[0]);
	LL_UNLINK(objlist, &list, &data[0]);
	for (i = 1, o = LL_FIRST(objlist, &list);
	    i < N;
	    i++, o = next_o) {
		assert(o != NULL);
		assert(o->satelite == i);

		next_o = LL_NEXT(objlist, &list, o);

		LL_RELEASE(objlist, &list, o);
	}

	return 0;
}